

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_SurfaceCurvature>::Append
          (ON_SimpleArray<ON_SurfaceCurvature> *this,ON_SurfaceCurvature *x)

{
  double dVar1;
  int iVar2;
  ON_SurfaceCurvature *pOVar3;
  ON_SurfaceCurvature *pOVar4;
  
  iVar2 = this->m_count;
  pOVar3 = x;
  if (iVar2 == this->m_capacity) {
    iVar2 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOVar3 = (ON_SurfaceCurvature *)onmalloc(0x10);
      dVar1 = x->k2;
      pOVar3->k1 = x->k1;
      pOVar3->k2 = dVar1;
    }
    Reserve(this,(long)iVar2);
    pOVar4 = this->m_a;
    if (pOVar4 == (ON_SurfaceCurvature *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar2 = this->m_count;
  }
  else {
    pOVar4 = this->m_a;
  }
  this->m_count = iVar2 + 1;
  dVar1 = pOVar3->k2;
  pOVar4[iVar2].k1 = pOVar3->k1;
  pOVar4[iVar2].k2 = dVar1;
  if (pOVar3 != x) {
    onfree(pOVar3);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}